

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scheduled_tasks.cc
# Opt level: O2

int __thiscall
aliyun::Ess::DescribeScheduledTasks
          (Ess *this,EssDescribeScheduledTasksRequestType *req,
          EssDescribeScheduledTasksResponseType *response,EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_146c;
  allocator<char> local_146b;
  allocator<char> local_146a;
  allocator<char> local_1469;
  Value val;
  undefined1 local_1448 [32];
  _Alloc_hider local_1428;
  size_type local_1420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1418;
  _Alloc_hider local_1408;
  size_type local_1400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13f8;
  _Alloc_hider local_13e8;
  size_type local_13e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13d8;
  _Alloc_hider local_13c8;
  size_type local_13c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13b8;
  _Alloc_hider local_13a8;
  size_type local_13a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1398;
  _Alloc_hider local_1388;
  size_type local_1380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1378;
  _Alloc_hider local_1368;
  size_type local_1360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1358;
  Int local_1348;
  bool local_1344;
  string str_response;
  string local_1320;
  string local_1300;
  string local_12e0;
  string local_12c0;
  string local_12a0;
  string local_1280;
  string local_1260;
  string local_1240;
  string local_1220;
  string local_1200;
  string local_11e0;
  string local_11c0;
  string local_11a0;
  string local_1180;
  string local_1160;
  string local_1140;
  string local_1120;
  string local_1100;
  string local_10e0;
  string local_10c0;
  string local_10a0;
  string local_1080;
  string local_1060;
  string local_1040;
  string local_1020;
  string local_1000;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  string local_e40;
  string local_e20;
  string local_e00;
  string local_de0;
  string local_dc0;
  string local_da0;
  string local_d80;
  string local_d60;
  string local_d40;
  string local_d20;
  string local_d00;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_1448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_1448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeScheduledTasks",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->page_number)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"PageNumber",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"PageSize",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((req->scheduled_action1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"ScheduledAction.1",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_3e0,(string *)&req->scheduled_action1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  if ((req->scheduled_action2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"ScheduledAction.2",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_420,(string *)&req->scheduled_action2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
  }
  if ((req->scheduled_action3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"ScheduledAction.3",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_460,(string *)&req->scheduled_action3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
  }
  if ((req->scheduled_action4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"ScheduledAction.4",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_4a0,(string *)&req->scheduled_action4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
  }
  if ((req->scheduled_action5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"ScheduledAction.5",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_4e0,(string *)&req->scheduled_action5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  if ((req->scheduled_action6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"ScheduledAction.6",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_520,(string *)&req->scheduled_action6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
  }
  if ((req->scheduled_action7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,"ScheduledAction.7",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_560,(string *)&req->scheduled_action7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_540);
  }
  if ((req->scheduled_action8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"ScheduledAction.8",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_5a0,(string *)&req->scheduled_action8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_580);
  }
  if ((req->scheduled_action9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,"ScheduledAction.9",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_5e0,(string *)&req->scheduled_action9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5c0);
  }
  if ((req->scheduled_action10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"ScheduledAction.10",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_620,(string *)&req->scheduled_action10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_600);
  }
  if ((req->scheduled_action11)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"ScheduledAction.11",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_660,(string *)&req->scheduled_action11);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_640);
  }
  if ((req->scheduled_action12)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,"ScheduledAction.12",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_6a0,(string *)&req->scheduled_action12);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_680,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_680);
  }
  if ((req->scheduled_action13)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"ScheduledAction.13",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_6e0,(string *)&req->scheduled_action13);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6c0,&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_6c0);
  }
  if ((req->scheduled_action14)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,"ScheduledAction.14",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_720,(string *)&req->scheduled_action14);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_700,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_700);
  }
  if ((req->scheduled_action15)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"ScheduledAction.15",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_760,(string *)&req->scheduled_action15);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_740,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_740);
  }
  if ((req->scheduled_action16)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,"ScheduledAction.16",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_7a0,(string *)&req->scheduled_action16);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_780,&local_7a0);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_780);
  }
  if ((req->scheduled_action17)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c0,"ScheduledAction.17",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_7e0,(string *)&req->scheduled_action17);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7c0,&local_7e0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_7c0);
  }
  if ((req->scheduled_action18)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,"ScheduledAction.18",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_820,(string *)&req->scheduled_action18);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_800,&local_820);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_800);
  }
  if ((req->scheduled_action19)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_840,"ScheduledAction.19",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_860,(string *)&req->scheduled_action19);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_840,&local_860);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_840);
  }
  if ((req->scheduled_action20)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_880,"ScheduledAction.20",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_8a0,(string *)&req->scheduled_action20);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_880,&local_8a0);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::__cxx11::string::~string((string *)&local_880);
  }
  if ((req->scheduled_task_id1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,"ScheduledTaskId.1",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_8e0,(string *)&req->scheduled_task_id1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8c0,&local_8e0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_8c0);
  }
  if ((req->scheduled_task_id2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_900,"ScheduledTaskId.2",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_920,(string *)&req->scheduled_task_id2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_900,&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::string::~string((string *)&local_900);
  }
  if ((req->scheduled_task_id3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_940,"ScheduledTaskId.3",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_960,(string *)&req->scheduled_task_id3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_940,&local_960);
    std::__cxx11::string::~string((string *)&local_960);
    std::__cxx11::string::~string((string *)&local_940);
  }
  if ((req->scheduled_task_id4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_980,"ScheduledTaskId.4",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_9a0,(string *)&req->scheduled_task_id4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_980,&local_9a0);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::__cxx11::string::~string((string *)&local_980);
  }
  if ((req->scheduled_task_id5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c0,"ScheduledTaskId.5",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_9e0,(string *)&req->scheduled_task_id5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_9c0,&local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::__cxx11::string::~string((string *)&local_9c0);
  }
  if ((req->scheduled_task_id6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a00,"ScheduledTaskId.6",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_a20,(string *)&req->scheduled_task_id6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a00,&local_a20);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_a00);
  }
  if ((req->scheduled_task_id7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"ScheduledTaskId.7",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_a60,(string *)&req->scheduled_task_id7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a40,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::string::~string((string *)&local_a40);
  }
  if ((req->scheduled_task_id8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"ScheduledTaskId.8",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_aa0,(string *)&req->scheduled_task_id8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a80,&local_aa0);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_a80);
  }
  if ((req->scheduled_task_id9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac0,"ScheduledTaskId.9",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_ae0,(string *)&req->scheduled_task_id9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_ac0,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::~string((string *)&local_ac0);
  }
  if ((req->scheduled_task_id10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b00,"ScheduledTaskId.10",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_b20,(string *)&req->scheduled_task_id10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b00,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_b00);
  }
  if ((req->scheduled_task_id11)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"ScheduledTaskId.11",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_b60,(string *)&req->scheduled_task_id11);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b40,&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_b40);
  }
  if ((req->scheduled_task_id12)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b80,"ScheduledTaskId.12",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_ba0,(string *)&req->scheduled_task_id12);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b80,&local_ba0);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string((string *)&local_b80);
  }
  if ((req->scheduled_task_id13)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc0,"ScheduledTaskId.13",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_be0,(string *)&req->scheduled_task_id13);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_bc0,&local_be0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)&local_bc0);
  }
  if ((req->scheduled_task_id14)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c00,"ScheduledTaskId.14",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_c20,(string *)&req->scheduled_task_id14);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_c00,&local_c20);
    std::__cxx11::string::~string((string *)&local_c20);
    std::__cxx11::string::~string((string *)&local_c00);
  }
  if ((req->scheduled_task_id15)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c40,"ScheduledTaskId.15",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_c60,(string *)&req->scheduled_task_id15);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_c40,&local_c60);
    std::__cxx11::string::~string((string *)&local_c60);
    std::__cxx11::string::~string((string *)&local_c40);
  }
  if ((req->scheduled_task_id16)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c80,"ScheduledTaskId.16",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_ca0,(string *)&req->scheduled_task_id16);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_c80,&local_ca0);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_c80);
  }
  if ((req->scheduled_task_id17)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc0,"ScheduledTaskId.17",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_ce0,(string *)&req->scheduled_task_id17);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_cc0,&local_ce0);
    std::__cxx11::string::~string((string *)&local_ce0);
    std::__cxx11::string::~string((string *)&local_cc0);
  }
  if ((req->scheduled_task_id18)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d00,"ScheduledTaskId.18",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_d20,(string *)&req->scheduled_task_id18);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_d00,&local_d20);
    std::__cxx11::string::~string((string *)&local_d20);
    std::__cxx11::string::~string((string *)&local_d00);
  }
  if ((req->scheduled_task_id19)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d40,"ScheduledTaskId.19",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_d60,(string *)&req->scheduled_task_id19);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_d40,&local_d60);
    std::__cxx11::string::~string((string *)&local_d60);
    std::__cxx11::string::~string((string *)&local_d40);
  }
  if ((req->scheduled_task_id20)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d80,"ScheduledTaskId.20",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_da0,(string *)&req->scheduled_task_id20);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_d80,&local_da0);
    std::__cxx11::string::~string((string *)&local_da0);
    std::__cxx11::string::~string((string *)&local_d80);
  }
  if ((req->scheduled_task_name1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc0,"ScheduledTaskName.1",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_de0,(string *)&req->scheduled_task_name1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_dc0,&local_de0);
    std::__cxx11::string::~string((string *)&local_de0);
    std::__cxx11::string::~string((string *)&local_dc0);
  }
  if ((req->scheduled_task_name2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e00,"ScheduledTaskName.2",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_e20,(string *)&req->scheduled_task_name2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_e00,&local_e20);
    std::__cxx11::string::~string((string *)&local_e20);
    std::__cxx11::string::~string((string *)&local_e00);
  }
  if ((req->scheduled_task_name3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e40,"ScheduledTaskName.3",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_e60,(string *)&req->scheduled_task_name3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_e40,&local_e60);
    std::__cxx11::string::~string((string *)&local_e60);
    std::__cxx11::string::~string((string *)&local_e40);
  }
  if ((req->scheduled_task_name4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e80,"ScheduledTaskName.4",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_ea0,(string *)&req->scheduled_task_name4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_e80,&local_ea0);
    std::__cxx11::string::~string((string *)&local_ea0);
    std::__cxx11::string::~string((string *)&local_e80);
  }
  if ((req->scheduled_task_name5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ec0,"ScheduledTaskName.5",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_ee0,(string *)&req->scheduled_task_name5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_ec0,&local_ee0);
    std::__cxx11::string::~string((string *)&local_ee0);
    std::__cxx11::string::~string((string *)&local_ec0);
  }
  if ((req->scheduled_task_name6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f00,"ScheduledTaskName.6",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_f20,(string *)&req->scheduled_task_name6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_f00,&local_f20);
    std::__cxx11::string::~string((string *)&local_f20);
    std::__cxx11::string::~string((string *)&local_f00);
  }
  if ((req->scheduled_task_name7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f40,"ScheduledTaskName.7",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_f60,(string *)&req->scheduled_task_name7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_f40,&local_f60);
    std::__cxx11::string::~string((string *)&local_f60);
    std::__cxx11::string::~string((string *)&local_f40);
  }
  if ((req->scheduled_task_name8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f80,"ScheduledTaskName.8",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_fa0,(string *)&req->scheduled_task_name8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_f80,&local_fa0);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::__cxx11::string::~string((string *)&local_f80);
  }
  if ((req->scheduled_task_name9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fc0,"ScheduledTaskName.9",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_fe0,(string *)&req->scheduled_task_name9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_fc0,&local_fe0);
    std::__cxx11::string::~string((string *)&local_fe0);
    std::__cxx11::string::~string((string *)&local_fc0);
  }
  if ((req->scheduled_task_name10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1000,"ScheduledTaskName.10",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_1020,(string *)&req->scheduled_task_name10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1000,&local_1020);
    std::__cxx11::string::~string((string *)&local_1020);
    std::__cxx11::string::~string((string *)&local_1000);
  }
  if ((req->scheduled_task_name11)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1040,"ScheduledTaskName.11",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_1060,(string *)&req->scheduled_task_name11);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1040,&local_1060);
    std::__cxx11::string::~string((string *)&local_1060);
    std::__cxx11::string::~string((string *)&local_1040);
  }
  if ((req->scheduled_task_name12)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1080,"ScheduledTaskName.12",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_10a0,(string *)&req->scheduled_task_name12);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1080,&local_10a0);
    std::__cxx11::string::~string((string *)&local_10a0);
    std::__cxx11::string::~string((string *)&local_1080);
  }
  if ((req->scheduled_task_name13)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10c0,"ScheduledTaskName.13",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_10e0,(string *)&req->scheduled_task_name13);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_10c0,&local_10e0);
    std::__cxx11::string::~string((string *)&local_10e0);
    std::__cxx11::string::~string((string *)&local_10c0);
  }
  if ((req->scheduled_task_name14)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1100,"ScheduledTaskName.14",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_1120,(string *)&req->scheduled_task_name14);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1100,&local_1120);
    std::__cxx11::string::~string((string *)&local_1120);
    std::__cxx11::string::~string((string *)&local_1100);
  }
  if ((req->scheduled_task_name15)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1140,"ScheduledTaskName.15",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_1160,(string *)&req->scheduled_task_name15);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1140,&local_1160);
    std::__cxx11::string::~string((string *)&local_1160);
    std::__cxx11::string::~string((string *)&local_1140);
  }
  if ((req->scheduled_task_name16)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1180,"ScheduledTaskName.16",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_11a0,(string *)&req->scheduled_task_name16);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1180,&local_11a0);
    std::__cxx11::string::~string((string *)&local_11a0);
    std::__cxx11::string::~string((string *)&local_1180);
  }
  if ((req->scheduled_task_name17)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11c0,"ScheduledTaskName.17",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_11e0,(string *)&req->scheduled_task_name17);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_11c0,&local_11e0);
    std::__cxx11::string::~string((string *)&local_11e0);
    std::__cxx11::string::~string((string *)&local_11c0);
  }
  if ((req->scheduled_task_name18)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1200,"ScheduledTaskName.18",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_1220,(string *)&req->scheduled_task_name18);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1200,&local_1220);
    std::__cxx11::string::~string((string *)&local_1220);
    std::__cxx11::string::~string((string *)&local_1200);
  }
  if ((req->scheduled_task_name19)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1240,"ScheduledTaskName.19",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_1260,(string *)&req->scheduled_task_name19);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1240,&local_1260);
    std::__cxx11::string::~string((string *)&local_1260);
    std::__cxx11::string::~string((string *)&local_1240);
  }
  if ((req->scheduled_task_name20)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1280,"ScheduledTaskName.20",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_12a0,(string *)&req->scheduled_task_name20);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1280,&local_12a0);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::__cxx11::string::~string((string *)&local_1280);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12c0,"OwnerAccount",(allocator<char> *)local_1448);
    std::__cxx11::string::string((string *)&local_12e0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_12c0,&local_12e0);
    std::__cxx11::string::~string((string *)&local_12e0);
    std::__cxx11::string::~string((string *)&local_12c0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1300,"RegionId",(allocator<char> *)local_1448);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1320,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1300,&local_1320);
    std::__cxx11::string::~string((string *)&local_1320);
    std::__cxx11::string::~string((string *)&local_1300);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_1448,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1448,anon_var_dwarf_10f6e6 + 9,&local_1469);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_1448);
        std::__cxx11::string::~string((string *)local_1448);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_1448,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1448,anon_var_dwarf_10f6e6 + 9,&local_146a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_1448);
        std::__cxx11::string::~string((string *)local_1448);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_1448,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1448,anon_var_dwarf_10f6e6 + 9,&local_146b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_1448);
        std::__cxx11::string::~string((string *)local_1448);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_1448,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1448,anon_var_dwarf_10f6e6 + 9,&local_146c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_1448);
        std::__cxx11::string::~string((string *)local_1448);
      }
      if (response != (EssDescribeScheduledTasksResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"TotalCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->total_count = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageNumber");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageNumber");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_number = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageSize");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageSize");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_size = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"ScheduledTasks");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ScheduledTasks");
          bVar1 = Json::Value::isMember(pVVar5,"ScheduledTask");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ScheduledTasks");
            pVVar5 = Json::Value::operator[](pVVar5,"ScheduledTask");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_1448._0_8_ = local_1448 + 0x10;
                local_1448._8_8_ = 0;
                local_1448[0x10] = '\0';
                local_1428._M_p = (pointer)&local_1418;
                local_1420 = 0;
                local_1418._M_local_buf[0] = '\0';
                local_1408._M_p = (pointer)&local_13f8;
                local_1400 = 0;
                local_13f8._M_local_buf[0] = '\0';
                local_13e8._M_p = (pointer)&local_13d8;
                local_13e0 = 0;
                local_13d8._M_local_buf[0] = '\0';
                local_13c8._M_p = (pointer)&local_13b8;
                local_13c0 = 0;
                local_13b8._M_local_buf[0] = '\0';
                local_13a8._M_p = (pointer)&local_1398;
                local_13a0 = 0;
                local_1398._M_local_buf[0] = '\0';
                local_1388._M_p = (pointer)&local_1378;
                local_1380 = 0;
                local_1378._M_local_buf[0] = '\0';
                local_1368._M_p = (pointer)&local_1358;
                local_1360 = 0;
                local_1358._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"ScheduledTaskId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ScheduledTaskId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)local_1448,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"ScheduledTaskName");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ScheduledTaskName");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_1428,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Description");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Description");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_1408,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"ScheduledAction");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ScheduledAction");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_13e8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"RecurrenceEndTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RecurrenceEndTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_13c8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"LaunchTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"LaunchTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_13a8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"RecurrenceType");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RecurrenceType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_1388,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"RecurrenceValue");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RecurrenceValue");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_1368,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"LaunchExpirationTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"LaunchExpirationTime");
                  local_1348 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"TaskEnabled");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"TaskEnabled");
                  local_1344 = Json::Value::asBool(pVVar6);
                }
                std::
                vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
                ::push_back(&response->scheduled_tasks,(value_type *)local_1448);
                EssDescribeScheduledTasksScheduledTaskType::
                ~EssDescribeScheduledTasksScheduledTaskType
                          ((EssDescribeScheduledTasksScheduledTaskType *)local_1448);
              }
            }
          }
        }
      }
      goto LAB_00141910;
    }
  }
  iVar2 = -1;
  if (error_info != (EssErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00141910:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ess::DescribeScheduledTasks(const EssDescribeScheduledTasksRequestType& req,
                      EssDescribeScheduledTasksResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScheduledTasks");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.scheduled_action1.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.1", req.scheduled_action1);
  }
  if(!req.scheduled_action2.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.2", req.scheduled_action2);
  }
  if(!req.scheduled_action3.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.3", req.scheduled_action3);
  }
  if(!req.scheduled_action4.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.4", req.scheduled_action4);
  }
  if(!req.scheduled_action5.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.5", req.scheduled_action5);
  }
  if(!req.scheduled_action6.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.6", req.scheduled_action6);
  }
  if(!req.scheduled_action7.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.7", req.scheduled_action7);
  }
  if(!req.scheduled_action8.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.8", req.scheduled_action8);
  }
  if(!req.scheduled_action9.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.9", req.scheduled_action9);
  }
  if(!req.scheduled_action10.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.10", req.scheduled_action10);
  }
  if(!req.scheduled_action11.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.11", req.scheduled_action11);
  }
  if(!req.scheduled_action12.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.12", req.scheduled_action12);
  }
  if(!req.scheduled_action13.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.13", req.scheduled_action13);
  }
  if(!req.scheduled_action14.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.14", req.scheduled_action14);
  }
  if(!req.scheduled_action15.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.15", req.scheduled_action15);
  }
  if(!req.scheduled_action16.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.16", req.scheduled_action16);
  }
  if(!req.scheduled_action17.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.17", req.scheduled_action17);
  }
  if(!req.scheduled_action18.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.18", req.scheduled_action18);
  }
  if(!req.scheduled_action19.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.19", req.scheduled_action19);
  }
  if(!req.scheduled_action20.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.20", req.scheduled_action20);
  }
  if(!req.scheduled_task_id1.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.1", req.scheduled_task_id1);
  }
  if(!req.scheduled_task_id2.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.2", req.scheduled_task_id2);
  }
  if(!req.scheduled_task_id3.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.3", req.scheduled_task_id3);
  }
  if(!req.scheduled_task_id4.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.4", req.scheduled_task_id4);
  }
  if(!req.scheduled_task_id5.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.5", req.scheduled_task_id5);
  }
  if(!req.scheduled_task_id6.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.6", req.scheduled_task_id6);
  }
  if(!req.scheduled_task_id7.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.7", req.scheduled_task_id7);
  }
  if(!req.scheduled_task_id8.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.8", req.scheduled_task_id8);
  }
  if(!req.scheduled_task_id9.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.9", req.scheduled_task_id9);
  }
  if(!req.scheduled_task_id10.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.10", req.scheduled_task_id10);
  }
  if(!req.scheduled_task_id11.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.11", req.scheduled_task_id11);
  }
  if(!req.scheduled_task_id12.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.12", req.scheduled_task_id12);
  }
  if(!req.scheduled_task_id13.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.13", req.scheduled_task_id13);
  }
  if(!req.scheduled_task_id14.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.14", req.scheduled_task_id14);
  }
  if(!req.scheduled_task_id15.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.15", req.scheduled_task_id15);
  }
  if(!req.scheduled_task_id16.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.16", req.scheduled_task_id16);
  }
  if(!req.scheduled_task_id17.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.17", req.scheduled_task_id17);
  }
  if(!req.scheduled_task_id18.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.18", req.scheduled_task_id18);
  }
  if(!req.scheduled_task_id19.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.19", req.scheduled_task_id19);
  }
  if(!req.scheduled_task_id20.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.20", req.scheduled_task_id20);
  }
  if(!req.scheduled_task_name1.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.1", req.scheduled_task_name1);
  }
  if(!req.scheduled_task_name2.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.2", req.scheduled_task_name2);
  }
  if(!req.scheduled_task_name3.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.3", req.scheduled_task_name3);
  }
  if(!req.scheduled_task_name4.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.4", req.scheduled_task_name4);
  }
  if(!req.scheduled_task_name5.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.5", req.scheduled_task_name5);
  }
  if(!req.scheduled_task_name6.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.6", req.scheduled_task_name6);
  }
  if(!req.scheduled_task_name7.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.7", req.scheduled_task_name7);
  }
  if(!req.scheduled_task_name8.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.8", req.scheduled_task_name8);
  }
  if(!req.scheduled_task_name9.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.9", req.scheduled_task_name9);
  }
  if(!req.scheduled_task_name10.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.10", req.scheduled_task_name10);
  }
  if(!req.scheduled_task_name11.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.11", req.scheduled_task_name11);
  }
  if(!req.scheduled_task_name12.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.12", req.scheduled_task_name12);
  }
  if(!req.scheduled_task_name13.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.13", req.scheduled_task_name13);
  }
  if(!req.scheduled_task_name14.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.14", req.scheduled_task_name14);
  }
  if(!req.scheduled_task_name15.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.15", req.scheduled_task_name15);
  }
  if(!req.scheduled_task_name16.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.16", req.scheduled_task_name16);
  }
  if(!req.scheduled_task_name17.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.17", req.scheduled_task_name17);
  }
  if(!req.scheduled_task_name18.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.18", req.scheduled_task_name18);
  }
  if(!req.scheduled_task_name19.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.19", req.scheduled_task_name19);
  }
  if(!req.scheduled_task_name20.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.20", req.scheduled_task_name20);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}